

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.hpp
# Opt level: O0

void __thiscall
diy::Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<int>_>_>::~Registrar
          (Registrar<diy::RegularLink<diy::Bounds<int>_>_> *this)

{
  void *in_RDI;
  
  ~Registrar((Registrar<diy::RegularLink<diy::Bounds<int>_>_> *)0x164408);
  operator_delete(in_RDI,0x20);
  return;
}

Assistant:

static bool registerT()
            {
                const auto name = typeid(T).name();
                Factory::data()[name] = [](Args... args) -> Base*
                {
                    return new T(std::forward<Args>(args)...);
                };
                return true;
            }